

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

uint rf_load_shader_program(uint v_shader_id,uint f_shader_id)

{
  uint uVar1;
  uint uVar2;
  int length;
  int max_len;
  int success;
  char *local_470;
  char *pcStack_468;
  undefined8 local_460;
  char *local_458;
  char *pcStack_450;
  undefined8 local_448;
  char *local_440;
  char *pcStack_438;
  undefined8 local_430;
  char log [1024];
  
  success = 0;
  uVar2 = 0;
  uVar1 = (*(rf__ctx->field_0).gfx_ctx.gl.CreateProgram)();
  (*(rf__ctx->field_0).gfx_ctx.gl.AttachShader)(uVar1,v_shader_id);
  (*(rf__ctx->field_0).gfx_ctx.gl.AttachShader)(uVar1,f_shader_id);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(uVar1,0,"vertex_position");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(uVar1,1,"vertex_tex_coord");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(uVar1,2,"vertex_normal");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(uVar1,3,"vertex_color");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(uVar1,4,"vertex_tangent");
  (*(rf__ctx->field_0).gfx_ctx.gl.BindAttribLocation)(uVar1,5,"vertex_tex_coord2");
  (*(rf__ctx->field_0).gfx_ctx.gl.LinkProgram)(uVar1);
  (*(rf__ctx->field_0).gfx_ctx.gl.GetProgramiv)(uVar1,0x8b82,&success);
  if (success == 0) {
    local_440 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_438 = "rf_load_shader_program";
    local_430 = 0x981c;
    rf_log_impl(4,0x175f52,(char *)(ulong)uVar1);
    max_len = 0;
    (*(rf__ctx->field_0).gfx_ctx.gl.GetProgramiv)(uVar1,0x8b84,&max_len);
    (*(rf__ctx->field_0).gfx_ctx.gl.GetProgramInfoLog)(uVar1,0x400,&length,log);
    local_458 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_450 = "rf_load_shader_program";
    local_448 = 0x9827;
    rf_log_impl(2,0x1739ab,log);
    (*(rf__ctx->field_0).gfx_ctx.gl.DeleteProgram)(uVar1);
  }
  else {
    local_470 = 
    "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    pcStack_468 = "rf_load_shader_program";
    local_460 = 0x982d;
    rf_log_impl(2,0x175f80,(char *)(ulong)uVar1);
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

RF_INTERNAL unsigned int rf_load_shader_program(unsigned int v_shader_id, unsigned int f_shader_id)
{
    unsigned int program = 0;

    int success = 0;
    program = rf_gl.CreateProgram();

    rf_gl.AttachShader(program, v_shader_id);
    rf_gl.AttachShader(program, f_shader_id);

    // NOTE: Default attribute shader locations must be binded before linking
    rf_gl.BindAttribLocation(program, 0, RF_DEFAULT_ATTRIB_POSITION_NAME);
    rf_gl.BindAttribLocation(program, 1, RF_DEFAULT_ATTRIB_TEXCOORD_NAME);
    rf_gl.BindAttribLocation(program, 2, RF_DEFAULT_ATTRIB_NORMAL_NAME);
    rf_gl.BindAttribLocation(program, 3, RF_DEFAULT_ATTRIB_COLOR_NAME);
    rf_gl.BindAttribLocation(program, 4, RF_DEFAULT_ATTRIB_TANGENT_NAME);
    rf_gl.BindAttribLocation(program, 5, RF_DEFAULT_ATTRIB_TEXCOORD2_NAME);

    // NOTE: If some attrib name is no found on the shader, it locations becomes -1

    rf_gl.LinkProgram(program);

    // NOTE: All uniform variables are intitialised to 0 when a program links

    rf_gl.GetProgramiv(program, GL_LINK_STATUS, &success);

    if (success == GL_FALSE)
    {
        RF_LOG(RF_LOG_TYPE_WARNING, "[SHDR ID %i] Failed to link shader program...", program);

        int max_len = 0;
        int length;

        rf_gl.GetProgramiv(program, GL_INFO_LOG_LENGTH, &max_len);

        char log[1024];

        rf_gl.GetProgramInfoLog(program, 1024, &length, log);

        RF_LOG(RF_LOG_TYPE_INFO, "%s", log);

        rf_gl.DeleteProgram(program);

        program = 0;
    }
    else RF_LOG(RF_LOG_TYPE_INFO, "[SHDR ID %i] rf_shader program loaded successfully", program);

    return program;
}